

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_palette.c
# Opt level: O0

bool_t prf_vertex_palette_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  long lVar1;
  uint16_t uVar2;
  ushort uVar3;
  uint16_t uVar4;
  int32_t iVar5;
  uint uVar6;
  void *pvVar7;
  prf_nodeinfo_t *ppVar8;
  bfile_t *in_RDX;
  prf_state_t *in_RSI;
  ushort *in_RDI;
  uint16_t *uint16ptr_1;
  uint16_t nodelength;
  uint16_t *uint16ptr;
  uint32_t newpos;
  uint32_t oldpos;
  prf_node_t subnode;
  prf_nodeinfo_t *subnodeinfo;
  uint16_t opcode;
  node_data_conflict12 *vpdata;
  prf_model_t fakemodel;
  int curptr;
  int32_t length;
  undefined6 in_stack_ffffffffffffff48;
  uint16_t in_stack_ffffffffffffff4e;
  bfile_t *in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff5c;
  bfile_t *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  pool_t pool_id;
  uint16_t local_90;
  ushort local_8e;
  uint in_stack_ffffffffffffff74;
  uint8_t *in_stack_ffffffffffffff78;
  bfile_t *in_stack_ffffffffffffff80;
  int local_28;
  bool_t local_4;
  
  pool_id = (pool_t)((uint)in_stack_ffffffffffffff6c >> 0x10);
  uVar2 = bf_get_uint16_be(in_stack_ffffffffffffff50);
  *in_RDI = uVar2;
  if (*in_RDI == prf_vertex_palette_info.opcode) {
    uVar3 = bf_get_int16_be(in_stack_ffffffffffffff50);
    in_RDI[1] = uVar3;
    iVar5 = bf_get_int32_be(in_stack_ffffffffffffff50);
    if ((4 < iVar5) && (*(long *)(in_RDI + 4) == 0)) {
      if (in_RSI->model->mempool_id == 0) {
        pvVar7 = malloc((long)iVar5);
        *(void **)(in_RDI + 4) = pvVar7;
      }
      else {
        pvVar7 = pool_malloc(pool_id,in_stack_ffffffffffffff68);
        *(void **)(in_RDI + 4) = pvVar7;
      }
      if (*(long *)(in_RDI + 4) == 0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        bf_rewind(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        return 0;
      }
    }
    **(int32_t **)(in_RDI + 4) = iVar5;
    for (local_28 = 8; local_28 < iVar5; local_28 = uVar6 + local_28) {
      bf_peek_uint16_be((bfile_t *)CONCAT26(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48));
      ppVar8 = prf_nodeinfo_get(in_stack_ffffffffffffff4e);
      if ((ppVar8 == (prf_nodeinfo_t *)0x0) ||
         (ppVar8->load_f == (_func_bool_t_prf_node_t_ptr_prf_state_t_ptr_bfile_t_ptr *)0x0)) {
        uVar2 = bf_get_uint16_be(in_stack_ffffffffffffff50);
        uVar4 = bf_get_uint16_be(in_stack_ffffffffffffff50);
        uVar6 = (uint)uVar4 << 0x10;
        in_stack_ffffffffffffff50 = (bfile_t *)(*(long *)(in_RDI + 4) + (long)local_28);
        in_stack_ffffffffffffff50->flags = uVar2;
        *(uint16_t *)&in_stack_ffffffffffffff50->field_0x2 = uVar4;
        if (4 < uVar4) {
          bf_read(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
        }
        uVar6 = uVar6 >> 0x10;
      }
      else {
        bf_get_position(in_RDX);
        in_stack_ffffffffffffff78 = (uint8_t *)(*(long *)(in_RDI + 4) + (long)local_28 + 4);
        (*ppVar8->load_f)((prf_node_t *)&local_90,in_RSI,in_RDX);
        bf_get_position(in_RDX);
        lVar1 = *(long *)(in_RDI + 4);
        *(uint16_t *)(lVar1 + local_28) = local_90;
        ((uint16_t *)(lVar1 + local_28))[1] = local_8e;
        if ((4 < local_8e) &&
           (in_stack_ffffffffffffff78 != (uint8_t *)(*(long *)(in_RDI + 4) + (long)local_28 + 4))) {
          memcpy((void *)(*(long *)(in_RDI + 4) + (long)local_28 + 4),in_stack_ffffffffffffff78,
                 (long)(int)(local_8e - 4));
        }
        uVar6 = (uint)local_8e;
      }
    }
    local_4 = 1;
  }
  else {
    prf_error(9,"tried vertex palette load method on node of type %d.",(ulong)*in_RDI);
    bf_rewind(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static
bool_t
prf_vertex_palette_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int32_t length;
    int curptr;
    prf_model_t fakemodel;
    node_data * vpdata;

    assert( node != NULL && state != NULL && bfile != NULL );
    
    fakemodel.header = NULL;
    fakemodel.mempool_id = 0;

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_vertex_palette_info.opcode ) {
        prf_error( 9, "tried vertex palette load method on node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_int16_be( bfile );
    length = bf_get_int32_be( bfile );

    if ( length > 4 && node->data == NULL ) {
        assert( state->model != NULL );
        if ( state->model->mempool_id != 0 ) {
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id, 
						 length );
        } else {
            node->data = (uint8_t *)malloc( length );
        }
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 8 );
            return FALSE;
        }
    }
    vpdata = (node_data *) node->data;
    vpdata->length = length;

    /* four bytes are skipped */
    curptr = 8;
    while ( curptr < length ) {
        /* do it the hard - but general way */
        uint16_t opcode;
        prf_nodeinfo_t * subnodeinfo;
        prf_node_t subnode;

        opcode = bf_peek_uint16_be( bfile );
        subnodeinfo = prf_nodeinfo_get( opcode );
        if ( subnodeinfo != NULL && subnodeinfo->load_f != NULL ) {
            uint32_t oldpos, newpos;
            uint16_t * uint16ptr;

            oldpos = bf_get_position( bfile );
            subnode.data = node->data + curptr + 4;
            (*(subnodeinfo->load_f))( &subnode, state, bfile );
            newpos = bf_get_position( bfile );
            assert( (newpos - oldpos) == subnode.length );
            uint16ptr = (uint16_t *) (node->data + curptr);
            uint16ptr[0] = subnode.opcode;
            uint16ptr[1] = subnode.length;
            if ( (subnode.length > 4) &&
                (subnode.data != (node->data + curptr + 4)) ) {
                assert( subnode.data != NULL );
                memcpy( node->data + curptr + 4, subnode.data,
                    subnode.length - 4 );
            }
            curptr += subnode.length;
        } else {
            uint16_t nodelength;
            uint16_t * uint16ptr;
            opcode = bf_get_uint16_be( bfile ); /* opcode */
            nodelength = bf_get_uint16_be( bfile );
            uint16ptr = (uint16_t *) (node->data + curptr);
            uint16ptr[0] = opcode;
            uint16ptr[1] = nodelength;
            if ( nodelength > 4 )
                bf_read( bfile, node->data + curptr + 4, nodelength - 4 );
            curptr += nodelength;
        }
    }

    return TRUE;
}